

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  SPIRVariable *var_00;
  SmallVector<Resource,_8UL> *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t value;
  SPIRType *pSVar3;
  ulong uVar4;
  Resource *pRVar5;
  Resource *pRVar6;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  SmallVector<Resource,_8UL> *local_1698;
  SmallVector<Resource,_8UL> *local_1500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f0 [32];
  spirv_cross local_14d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b0 [32];
  spirv_cross local_1490 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1470 [32];
  spirv_cross local_1450 [36];
  TypedID<(spirv_cross::Types)1> local_142c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428 [32];
  spirv_cross local_1408 [32];
  TypedID<(spirv_cross::Types)1> local_13e8;
  key_type local_13e4;
  SetBindingPair pair;
  TypedID<(spirv_cross::Types)1> local_13d4;
  uint32_t binding;
  TypedID<(spirv_cross::Types)1> local_13cc;
  SPIRType *local_13c8;
  SPIRType *sampler_type_array;
  SPIRType *pSStack_13b8;
  uint32_t sampler_type_array_id;
  SPIRType *new_sampler_type;
  byte local_13a5;
  uint32_t sampler_type_id;
  spirv_cross local_13a0 [3];
  bool type_is_array;
  allocator local_1379;
  string local_1378 [32];
  string local_1358 [32];
  undefined1 local_1338 [8];
  string mbr_name;
  SPIRType *type;
  SPIRVariable *var_3;
  Resource *resource;
  Resource *__end2;
  Resource *__begin2;
  SmallVector<Resource,_8UL> *__range2;
  uint32_t member_index;
  ID local_12c0;
  StorageClass local_12bc;
  uint32_t local_12b8;
  TypedID<(spirv_cross::Types)1> local_12b4;
  uint32_t buffer_variable_id;
  SPIRType *ptr_type;
  ID local_1284;
  ID local_1280;
  ID local_127c;
  SPIRType *local_1278;
  SPIRType *buffer_type;
  uint32_t local_1268;
  uint32_t ptr_type_id;
  uint32_t type_id;
  uint32_t next_id;
  SmallVector<Resource,_8UL> *resources;
  undefined1 auStack_1250 [4];
  uint32_t desc_set_2;
  undefined1 local_1248 [32];
  BaseType local_1228;
  uint32_t local_1224;
  uint32_t local_1220;
  ID local_1218;
  uint local_1214;
  SPIRVariable *pSStack_1210;
  uint32_t desc_set_1;
  SPIRVariable *var_2;
  TypedID<(spirv_cross::Types)0> *pTStack_1200;
  uint32_t var_id_2;
  uint *__end1_1;
  uint *__begin1_1;
  SmallVector<unsigned_int,_8UL> *__range1_1;
  undefined1 local_11e0 [32];
  BaseType local_11c0;
  uint32_t local_11bc;
  uint32_t local_11b8;
  ID local_11ac;
  ID local_11a8;
  allocator local_11a1;
  string local_11a0 [32];
  ID local_1180;
  StorageClass local_117c;
  SPIRVariable *local_1178;
  SPIRVariable *var_1;
  undefined1 auStack_1168 [4];
  uint32_t var_id_1;
  undefined1 local_1160 [32];
  BaseType local_1140;
  uint32_t local_113c;
  uint32_t local_1138;
  ID local_112c;
  ID local_1128;
  allocator local_1121;
  string local_1120 [32];
  ID local_1100;
  StorageClass local_10fc;
  SPIRVariable *local_10f8;
  SPIRVariable *var;
  ID local_10e8;
  uint32_t var_id;
  undefined1 local_10e0 [8];
  SPIRType uint_type_pointer;
  uint local_f88;
  uint32_t desc_set;
  uint32_t uint_ptr_type_id;
  anon_class_48_6_f64cba6c local_f78;
  bool local_f41;
  bool abStack_f40 [7];
  bool needs_buffer_sizes;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  SmallVector<Resource,_8UL> resources_in_set [8];
  uint32_t *id;
  uint32_t *__end1;
  uint32_t *__begin1;
  uint32_t (*__range1) [8];
  CompilerMSL *this_local;
  
  for (__end1 = this->argument_buffer_ids; __end1 != &this->argument_buffer_discrete_mask;
      __end1 = __end1 + 1) {
    *__end1 = 0;
  }
  local_1500 = (SmallVector<Resource,_8UL> *)(inline_block_vars.stack_storage.aligned_char + 0x18);
  do {
    SmallVector<Resource,_8UL>::SmallVector(local_1500);
    local_1500 = local_1500 + 1;
  } while (local_1500 !=
           (SmallVector<Resource,_8UL> *)(resources_in_set[7].stack_storage.aligned_char + 0x1b8));
  SmallVector<unsigned_int,_8UL>::SmallVector
            ((SmallVector<unsigned_int,_8UL> *)set_needs_swizzle_buffer);
  set_needs_buffer_sizes[0] = false;
  set_needs_buffer_sizes[1] = false;
  set_needs_buffer_sizes[2] = false;
  set_needs_buffer_sizes[3] = false;
  set_needs_buffer_sizes[4] = false;
  set_needs_buffer_sizes[5] = false;
  set_needs_buffer_sizes[6] = false;
  set_needs_buffer_sizes[7] = false;
  abStack_f40[0] = false;
  abStack_f40[1] = false;
  abStack_f40[2] = false;
  abStack_f40[3] = false;
  abStack_f40[4] = false;
  abStack_f40[5] = false;
  abStack_f40[6] = false;
  needs_buffer_sizes = false;
  local_f41 = false;
  local_f78.resources_in_set =
       (SmallVector<Resource,_8UL> (*) [8])(inline_block_vars.stack_storage.aligned_char + 0x18);
  local_f78.set_needs_swizzle_buffer = &set_needs_buffer_sizes;
  local_f78.set_needs_buffer_sizes = (bool (*) [8])abStack_f40;
  local_f78.needs_buffer_sizes = &local_f41;
  local_f78.this = this;
  local_f78.inline_block_vars = (SmallVector<unsigned_int,_8UL> *)set_needs_swizzle_buffer;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::analyze_argument_buffers()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_f78);
  if (((this->needs_swizzle_buffer_def & 1U) != 0) || ((local_f41 & 1U) != 0)) {
    local_f88 = 0;
    for (uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ = 0;
        uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ < 8;
        uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ =
             uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ + 1) {
      if (((set_needs_buffer_sizes[uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_]
           & 1U) != 0) ||
         ((inline_block_vars.stack_storage.aligned_char
           [(ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ - 0x30] & 1U) !=
          0)) {
        if (local_f88 == 0) {
          local_f88 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          pSVar3 = get_uint_type(this);
          SPIRType::SPIRType((SPIRType *)local_10e0,pSVar3);
          uint_type_pointer.array_size_literal.stack_storage.aligned_char[4] = '\x01';
          uint_type_pointer.array_size_literal.stack_storage.aligned_char[0] = '\x01';
          uint_type_pointer.array_size_literal.stack_storage.aligned_char[1] = '\0';
          uint_type_pointer.array_size_literal.stack_storage.aligned_char[2] = '\0';
          uint_type_pointer.array_size_literal.stack_storage.aligned_char[3] = '\0';
          uVar2 = get_uint_type_id(this);
          TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)&var_id,uVar2);
          uint_type_pointer.image.access = var_id;
          uint_type_pointer.pointer_depth = 2;
          Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                    ((Compiler *)this,local_f88,(SPIRType *)local_10e0);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_10e8,local_f88);
          Compiler::set_decoration((Compiler *)this,local_10e8,DecorationArrayStride,4);
          SPIRType::~SPIRType((SPIRType *)local_10e0);
        }
        if ((set_needs_buffer_sizes[uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_]
            & 1U) != 0) {
          var._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          local_10fc = StorageClassUniformConstant;
          local_10f8 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                 ((Compiler *)this,var._4_4_,&local_f88,&local_10fc);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1100,var._4_4_);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1120,"spvSwizzleConstants",&local_1121);
          Compiler::set_name((Compiler *)this,local_1100,(string *)local_1120);
          ::std::__cxx11::string::~string(local_1120);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1121);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1128,var._4_4_);
          Compiler::set_decoration
                    ((Compiler *)this,local_1128,DecorationDescriptorSet,
                     uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_112c,var._4_4_);
          Compiler::set_decoration((Compiler *)this,local_112c,DecorationBinding,0xfffffffe);
          uVar4 = (ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_;
          _auStack_1168 = local_10f8;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_1160,this,(ulong)var._4_4_);
          local_1140 = UInt;
          local_113c = get_metal_resource_index(this,local_10f8,UInt,0);
          local_1138 = 0;
          SmallVector<Resource,_8UL>::push_back
                    ((SmallVector<Resource,_8UL> *)
                     (resources_in_set[uVar4 - 1].stack_storage.aligned_char + 0x1b8),
                     (Resource *)auStack_1168);
          analyze_argument_buffers::Resource::~Resource((Resource *)auStack_1168);
        }
        if ((inline_block_vars.stack_storage.aligned_char
             [(ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ - 0x30] & 1U)
            != 0) {
          var_1._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
          ;
          local_117c = StorageClassUniformConstant;
          local_1178 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                 ((Compiler *)this,var_1._4_4_,&local_f88,&local_117c);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1180,var_1._4_4_);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_11a0,"spvBufferSizeConstants",&local_11a1);
          Compiler::set_name((Compiler *)this,local_1180,(string *)local_11a0);
          ::std::__cxx11::string::~string(local_11a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_11a8,var_1._4_4_);
          Compiler::set_decoration
                    ((Compiler *)this,local_11a8,DecorationDescriptorSet,
                     uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_11ac,var_1._4_4_);
          Compiler::set_decoration((Compiler *)this,local_11ac,DecorationBinding,0xfffffffd);
          uVar4 = (ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_;
          __range1_1 = (SmallVector<unsigned_int,_8UL> *)local_1178;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_11e0,this,(ulong)var_1._4_4_);
          local_11c0 = UInt;
          local_11bc = get_metal_resource_index(this,local_1178,UInt,0);
          local_11b8 = 0;
          SmallVector<Resource,_8UL>::push_back
                    ((SmallVector<Resource,_8UL> *)
                     (resources_in_set[uVar4 - 1].stack_storage.aligned_char + 0x1b8),
                     (Resource *)&__range1_1);
          analyze_argument_buffers::Resource::~Resource((Resource *)&__range1_1);
        }
      }
    }
  }
  __begin1_1 = (uint *)set_needs_swizzle_buffer;
  __end1_1 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin1_1);
  pTStack_1200 = (TypedID<(spirv_cross::Types)0> *)
                 VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1_1);
  for (; (TypedID<(spirv_cross::Types)0> *)__end1_1 != pTStack_1200; __end1_1 = __end1_1 + 1) {
    var_2._4_4_ = *__end1_1;
    pSStack_1210 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_2._4_4_);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_1218,var_2._4_4_);
    local_1214 = Compiler::get_decoration((Compiler *)this,local_1218,DecorationDescriptorSet);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,var_2._4_4_);
    uVar4 = (ulong)local_1214;
    _auStack_1250 = pSStack_1210;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_1248,this,(ulong)var_2._4_4_);
    local_1228 = Struct;
    local_1224 = get_metal_resource_index(this,pSStack_1210,Struct,0);
    local_1220 = 0;
    SmallVector<Resource,_8UL>::push_back
              ((SmallVector<Resource,_8UL> *)
               (resources_in_set[uVar4 - 1].stack_storage.aligned_char + 0x1b8),
               (Resource *)auStack_1250);
    analyze_argument_buffers::Resource::~Resource((Resource *)auStack_1250);
  }
  resources._4_4_ = 0;
  do {
    if (7 < resources._4_4_) {
      SmallVector<unsigned_int,_8UL>::~SmallVector
                ((SmallVector<unsigned_int,_8UL> *)set_needs_swizzle_buffer);
      local_1698 = (SmallVector<Resource,_8UL> *)
                   (resources_in_set[7].stack_storage.aligned_char + 0x1b8);
      do {
        local_1698 = local_1698 + -1;
        SmallVector<Resource,_8UL>::~SmallVector(local_1698);
      } while (local_1698 !=
               (SmallVector<Resource,_8UL> *)(inline_block_vars.stack_storage.aligned_char + 0x18));
      return;
    }
    _type_id = (SmallVector<Resource,_8UL> *)
               (resources_in_set[(ulong)resources._4_4_ - 1].stack_storage.aligned_char + 0x1b8);
    bVar1 = VectorView<Resource>::empty((VectorView<Resource> *)_type_id);
    if (!bVar1) {
      bVar1 = descriptor_set_is_argument_buffer(this,resources._4_4_);
      if (!bVar1) {
        __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x350d,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
      }
      ptr_type_id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
      local_1268 = ptr_type_id + 1;
      buffer_type._4_4_ = ptr_type_id + 2;
      this->argument_buffer_ids[resources._4_4_] = ptr_type_id;
      local_1278 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,local_1268);
      *(undefined4 *)&(local_1278->super_IVariant).field_0xc = 0xf;
      if ((this->argument_buffer_device_storage_mask & 1 << ((byte)resources._4_4_ & 0x1f)) == 0) {
        local_1278->storage = StorageClassUniform;
      }
      else {
        local_1278->storage = StorageClassStorageBuffer;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_127c,ptr_type_id);
        Compiler::set_decoration((Compiler *)this,local_127c,DecorationNonWritable,0);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_1280,local_1268);
        Compiler::set_decoration((Compiler *)this,local_1280,DecorationBlock,0);
      }
      TypedID<(spirv_cross::Types)0>::TypedID(&local_1284,local_1268);
      join<char_const(&)[23],unsigned_int&>
                ((spirv_cross *)&ptr_type,(char (*) [23])"spvDescriptorSetBuffer",
                 (uint *)((long)&resources + 4));
      Compiler::set_name((Compiler *)this,local_1284,(string *)&ptr_type);
      ::std::__cxx11::string::~string((string *)&ptr_type);
      _buffer_variable_id = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,buffer_type._4_4_)
      ;
      SPIRType::operator=(_buffer_variable_id,local_1278);
      _buffer_variable_id->pointer = true;
      _buffer_variable_id->pointer_depth = 1;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_12b4,local_1268);
      (_buffer_variable_id->parent_type).id = local_12b4.id;
      local_12b8 = ptr_type_id;
      local_12bc = StorageClassUniform;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                ((Compiler *)this,ptr_type_id,(uint *)((long)&buffer_type + 4),&local_12bc);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_12c0,local_12b8);
      join<char_const(&)[17],unsigned_int&>
                ((spirv_cross *)&member_index,(char (*) [17])"spvDescriptorSet",
                 (uint *)((long)&resources + 4));
      Compiler::set_name((Compiler *)this,local_12c0,(string *)&member_index);
      ::std::__cxx11::string::~string((string *)&member_index);
      pRVar5 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource,8ul>>
                         (_type_id);
      pRVar6 = ::std::
               end<spirv_cross::SmallVector<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource,8ul>>
                         (_type_id);
      ::std::
      sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>
                (pRVar5,pRVar6);
      this_00 = _type_id;
      __range2._0_4_ = 0;
      __end2 = VectorView<Resource>::begin(&_type_id->super_VectorView<Resource>);
      pRVar5 = VectorView<Resource>::end(&this_00->super_VectorView<Resource>);
      for (; __end2 != pRVar5; __end2 = __end2 + 1) {
        var_00 = __end2->var;
        pSVar3 = Compiler::get_variable_data_type((Compiler *)this,var_00);
        ::std::__cxx11::string::string(local_1358,(string *)&__end2->name);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1378,"m",&local_1379);
        ensure_valid_name((CompilerMSL *)local_1338,(string *)this,(string *)local_1358);
        ::std::__cxx11::string::~string(local_1378);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1379);
        ::std::__cxx11::string::~string(local_1358);
        if (__end2->plane != 0) {
          join<std::__cxx11::string&,unsigned_int&>
                    (local_13a0,&this->plane_name_suffix,&__end2->plane);
          ::std::__cxx11::string::operator+=((string *)local_1338,(string *)local_13a0);
          ::std::__cxx11::string::~string((string *)local_13a0);
        }
        sampler_type_id =
             (uint32_t)
             TypedID::operator_cast_to_TypedID((TypedID *)&(local_1278->super_IVariant).self);
        Compiler::set_member_name
                  ((Compiler *)this,(TypeID)sampler_type_id,(uint32_t)__range2,(string *)local_1338)
        ;
        if ((__end2->basetype == Sampler) && (*(int *)&(pSVar3->super_IVariant).field_0xc != 0x12))
        {
          bVar1 = VectorView<unsigned_int>::empty(&(pSVar3->array).super_VectorView<unsigned_int>);
          local_13a5 = !bVar1;
          new_sampler_type._4_4_ =
               ParsedIR::increase_bound_by
                         (&(this->super_CompilerGLSL).super_Compiler.ir,local_13a5 + 1);
          pSStack_13b8 = Compiler::set<spirv_cross::SPIRType>
                                   ((Compiler *)this,new_sampler_type._4_4_);
          *(undefined4 *)&(pSStack_13b8->super_IVariant).field_0xc = 0x12;
          pSStack_13b8->storage = StorageClassUniformConstant;
          if ((local_13a5 & 1) == 0) {
            pSVar7 = &local_1278->member_types;
            TypedID<(spirv_cross::Types)1>::TypedID(&local_13d4,new_sampler_type._4_4_);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      (pSVar7,&local_13d4);
          }
          else {
            sampler_type_array._4_4_ = new_sampler_type._4_4_ + 1;
            local_13c8 = Compiler::set<spirv_cross::SPIRType>
                                   ((Compiler *)this,sampler_type_array._4_4_);
            SPIRType::operator=(local_13c8,pSStack_13b8);
            SmallVector<unsigned_int,_8UL>::operator=(&local_13c8->array,&pSVar3->array);
            SmallVector<bool,_8UL>::operator=
                      (&local_13c8->array_size_literal,&pSVar3->array_size_literal);
            TypedID<(spirv_cross::Types)1>::TypedID(&local_13cc,new_sampler_type._4_4_);
            (local_13c8->parent_type).id = local_13cc.id;
            pSVar7 = &local_1278->member_types;
            TypedID<(spirv_cross::Types)1>::TypedID
                      ((TypedID<(spirv_cross::Types)1> *)&binding,sampler_type_array._4_4_);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      (pSVar7,(TypedID<(spirv_cross::Types)1> *)&binding);
          }
        }
        else {
          pair.desc_set = (var_00->super_IVariant).self.id;
          local_13e4.binding =
               Compiler::get_decoration((Compiler *)this,(ID)pair.desc_set,DecorationBinding);
          local_13e4.desc_set = resources._4_4_;
          pair.binding = local_13e4.binding;
          if ((__end2->basetype == Image) ||
             ((__end2->basetype == Sampler || (__end2->basetype == SampledImage)))) {
            pSVar7 = &local_1278->member_types;
            uVar2 = Compiler::get_variable_data_type_id((Compiler *)this,var_00);
            TypedID<(spirv_cross::Types)1>::TypedID(&local_13e8,uVar2);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      (pSVar7,&local_13e8);
            if (__end2->plane == 0) {
              uVar2 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(var_00->super_IVariant).self);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_1428,this,(ulong)local_12b8,1);
              join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                        (local_1408,local_1428,(char (*) [2])0x4dfd16,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1338);
              Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_1408);
              ::std::__cxx11::string::~string((string *)local_1408);
              ::std::__cxx11::string::~string((string *)local_1428);
            }
          }
          else {
            sVar8 = ::std::
                    map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    ::count(&this->buffers_requiring_dynamic_offset,&local_13e4);
            if (sVar8 == 0) {
              sVar10 = ::std::
                       unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
                       ::count(&this->inline_uniform_blocks,&local_13e4);
              if (sVar10 == 0) {
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          (&local_1278->member_types,
                           (TypedID<(spirv_cross::Types)1> *)&(var_00->super_IVariant).field_0xc);
                bVar1 = VectorView<unsigned_int>::empty
                                  (&(pSVar3->array).super_VectorView<unsigned_int>);
                if (bVar1) {
                  uVar2 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&(var_00->super_IVariant).self);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_14b0,this,(ulong)local_12b8,1);
                  join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (local_1490,(char (*) [3])"(*",local_14b0,(char (*) [2])0x4dfd16,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1338,(char (*) [2])0x4dff7a);
                  Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_1490);
                  ::std::__cxx11::string::~string((string *)local_1490);
                  ::std::__cxx11::string::~string((string *)local_14b0);
                }
                else {
                  uVar2 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&(var_00->super_IVariant).self);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_14f0,this,(ulong)local_12b8,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            (local_14d0,local_14f0,(char (*) [2])0x4dfd16,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1338);
                  Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_14d0);
                  ::std::__cxx11::string::~string((string *)local_14d0);
                  ::std::__cxx11::string::~string((string *)local_14f0);
                }
              }
              else {
                pSVar7 = &local_1278->member_types;
                uVar2 = Compiler::get_variable_data_type_id((Compiler *)this,var_00);
                TypedID<(spirv_cross::Types)1>::TypedID(&local_142c,uVar2);
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          (pSVar7,&local_142c);
                uVar2 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(var_00->super_IVariant).self);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (local_1470,this,(ulong)local_12b8,1);
                join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                          (local_1450,local_1470,(char (*) [2])0x4dfd16,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1338);
                Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_1450);
                ::std::__cxx11::string::~string((string *)local_1450);
                ::std::__cxx11::string::~string((string *)local_1470);
              }
            }
            else {
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                        (&local_1278->member_types,
                         (TypedID<(spirv_cross::Types)1> *)&(var_00->super_IVariant).field_0xc);
              uVar2 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(var_00->super_IVariant).self);
              pmVar9 = ::std::
                       map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                       ::operator[](&this->buffers_requiring_dynamic_offset,&local_13e4);
              pmVar9->second = uVar2;
            }
          }
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_1278->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,uVar2,(uint32_t)__range2,
                   SPIRVCrossDecorationResourceIndexPrimary,__end2->index);
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_1278->super_IVariant).self);
        value = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_00->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,uVar2,(uint32_t)__range2,SPIRVCrossDecorationInterfaceOrigID,
                   value);
        __range2._0_4_ = (uint32_t)__range2 + 1;
        ::std::__cxx11::string::~string((string *)local_1338);
      }
    }
    resources._4_4_ = resources._4_4_ + 1;
  } while( true );
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				if (!msl_options.is_ios() || type.basetype != SPIRType::Image || type.image.sampled != 2)
				{
					add_resource_name(var_id);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), type.basetype, get_metal_resource_index(var, type.basetype), 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffers_requiring_array_length.count(var_id) != 0)
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth = 1;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth = 1;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);
			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else
				{
					// Resources will be declared as pointers not references, so automatically dereference as appropriate.
					buffer_type.member_types.push_back(var.basetype);
					if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}